

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool validate_get_msurf_descriptors
               (_func_void_integral_image_ptr_interest_point_ptr *original_function,
               vector<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
               *test_functions,integral_image *iimage,
               vector<interest_point,_std::allocator<interest_point>_> *interest_points)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  float *a;
  float *pfVar4;
  const_reference pp_Var5;
  vector<interest_point,_std::allocator<interest_point>_> *in_RCX;
  integral_image *in_RDX;
  vector<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
  *in_RSI;
  code *in_RDI;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  bool valid_1;
  interest_point test_ipoint;
  int j;
  bool valid;
  interest_point ref_ipoint;
  int i;
  bool all_valid;
  vector<interest_point,_std::allocator<interest_point>_> original_interest_points;
  float in_stack_fffffffffffffd48;
  undefined2 in_stack_fffffffffffffd4c;
  undefined1 in_stack_fffffffffffffd4e;
  undefined1 in_stack_fffffffffffffd4f;
  const_reference in_stack_fffffffffffffd50;
  const_reference in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd78 [64];
  uint local_16c;
  undefined1 local_158 [64];
  undefined1 local_118 [64];
  undefined1 local_d8 [64];
  undefined1 auStack_98 [20];
  undefined1 local_84 [44];
  undefined1 auStack_58 [20];
  int local_40;
  byte local_39;
  vector<interest_point,_std::allocator<interest_point>_> *local_20;
  integral_image *local_18;
  vector<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
  *local_10;
  code *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<interest_point,_std::allocator<interest_point>_>::vector
            (in_stack_fffffffffffffd78._40_8_,in_stack_fffffffffffffd78._32_8_);
  local_39 = 1;
  local_40 = 0x32;
  while( true ) {
    uVar2 = (ulong)local_40;
    sVar3 = std::vector<interest_point,_std::allocator<interest_point>_>::size(local_20);
    if (sVar3 <= uVar2) break;
    in_stack_fffffffffffffd60 =
         std::vector<interest_point,_std::allocator<interest_point>_>::at
                   ((vector<interest_point,_std::allocator<interest_point>_> *)
                    in_stack_fffffffffffffd50,
                    CONCAT17(in_stack_fffffffffffffd4f,
                             CONCAT16(in_stack_fffffffffffffd4e,
                                      CONCAT24(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48))
                            ));
    auVar6 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_stack_fffffffffffffd60->descriptor + 0x30))
    ;
    auVar6 = vmovdqu64_avx512f(auVar6);
    auStack_58 = auVar6._44_20_;
    auVar6._0_4_ = in_stack_fffffffffffffd60->x;
    auVar6._4_4_ = in_stack_fffffffffffffd60->y;
    auVar6._8_4_ = in_stack_fffffffffffffd60->scale;
    auVar6._12_4_ = in_stack_fffffffffffffd60->orientation;
    auVar6[0x10] = in_stack_fffffffffffffd60->upright;
    auVar6[0x11] = in_stack_fffffffffffffd60->laplacian;
    auVar6._18_2_ = *(undefined2 *)&in_stack_fffffffffffffd60->field_0x12;
    auVar6._20_4_ = in_stack_fffffffffffffd60->descriptor[0];
    auVar6._24_4_ = in_stack_fffffffffffffd60->descriptor[1];
    auVar6._28_4_ = in_stack_fffffffffffffd60->descriptor[2];
    auVar6._32_4_ = in_stack_fffffffffffffd60->descriptor[3];
    auVar6._36_4_ = in_stack_fffffffffffffd60->descriptor[4];
    auVar6._40_4_ = in_stack_fffffffffffffd60->descriptor[5];
    auVar6._44_4_ = in_stack_fffffffffffffd60->descriptor[6];
    auVar6._48_4_ = in_stack_fffffffffffffd60->descriptor[7];
    auVar6._52_4_ = in_stack_fffffffffffffd60->descriptor[8];
    auVar6._56_4_ = in_stack_fffffffffffffd60->descriptor[9];
    auVar6._60_4_ = in_stack_fffffffffffffd60->descriptor[10];
    auVar7 = vmovdqu64_avx512f(auVar6);
    auVar8 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_stack_fffffffffffffd60->descriptor + 0xb));
    auVar9 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_stack_fffffffffffffd60->descriptor + 0x1b))
    ;
    auVar6 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_stack_fffffffffffffd60->descriptor + 0x2b))
    ;
    auVar6 = vmovdqu64_avx512f(auVar6);
    auStack_98 = auVar6._0_20_;
    local_84 = auVar6._20_44_;
    local_d8 = vmovdqu64_avx512f(auVar9);
    local_118 = vmovdqu64_avx512f(auVar8);
    local_158 = vmovdqu64_avx512f(auVar7);
    (*local_8)(local_18,local_158);
    local_16c = 0;
    while( true ) {
      a = (float *)(long)(int)local_16c;
      pfVar4 = (float *)std::
                        vector<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
                        ::size(local_10);
      if (pfVar4 <= a) break;
      in_stack_fffffffffffffd50 =
           std::vector<interest_point,_std::allocator<interest_point>_>::at
                     ((vector<interest_point,_std::allocator<interest_point>_> *)
                      in_stack_fffffffffffffd50,
                      CONCAT17(in_stack_fffffffffffffd4f,
                               CONCAT16(in_stack_fffffffffffffd4e,
                                        CONCAT24(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48
                                                ))));
      auVar6 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                  (in_stack_fffffffffffffd50->descriptor + 0x30));
      vmovdqu64_avx512f(auVar6);
      auVar7._0_4_ = in_stack_fffffffffffffd50->x;
      auVar7._4_4_ = in_stack_fffffffffffffd50->y;
      auVar7._8_4_ = in_stack_fffffffffffffd50->scale;
      auVar7._12_4_ = in_stack_fffffffffffffd50->orientation;
      auVar7[0x10] = in_stack_fffffffffffffd50->upright;
      auVar7[0x11] = in_stack_fffffffffffffd50->laplacian;
      auVar7._18_2_ = *(undefined2 *)&in_stack_fffffffffffffd50->field_0x12;
      auVar7._20_4_ = in_stack_fffffffffffffd50->descriptor[0];
      auVar7._24_4_ = in_stack_fffffffffffffd50->descriptor[1];
      auVar7._28_4_ = in_stack_fffffffffffffd50->descriptor[2];
      auVar7._32_4_ = in_stack_fffffffffffffd50->descriptor[3];
      auVar7._36_4_ = in_stack_fffffffffffffd50->descriptor[4];
      auVar7._40_4_ = in_stack_fffffffffffffd50->descriptor[5];
      auVar7._44_4_ = in_stack_fffffffffffffd50->descriptor[6];
      auVar7._48_4_ = in_stack_fffffffffffffd50->descriptor[7];
      auVar7._52_4_ = in_stack_fffffffffffffd50->descriptor[8];
      auVar7._56_4_ = in_stack_fffffffffffffd50->descriptor[9];
      auVar7._60_4_ = in_stack_fffffffffffffd50->descriptor[10];
      auVar6 = vmovdqu64_avx512f(auVar7);
      auVar7 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_stack_fffffffffffffd50->descriptor + 0xb)
                                );
      auVar8 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                  (in_stack_fffffffffffffd50->descriptor + 0x1b));
      auVar9 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                  (in_stack_fffffffffffffd50->descriptor + 0x2b));
      vmovdqu64_avx512f(auVar9);
      vmovdqu64_avx512f(auVar8);
      vmovdqu64_avx512f(auVar7);
      vmovdqu64_avx512f(auVar6);
      pp_Var5 = std::
                vector<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
                ::operator[](local_10,(long)(int)local_16c);
      (**pp_Var5)(local_18,(interest_point *)&stack0xfffffffffffffd78);
      bVar1 = compare_arrays_close
                        (a,&in_stack_fffffffffffffd50->x,
                         CONCAT13(in_stack_fffffffffffffd4f,
                                  CONCAT12(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd4c)),
                         in_stack_fffffffffffffd48);
      in_stack_fffffffffffffd4f = bVar1;
      if (!bVar1) {
        printf("ERROR: MSURF descriptor test function %d does not match original function\n",
               (ulong)local_16c);
      }
      local_39 = (local_39 & 1 & bVar1) != 0;
      local_16c = local_16c + 1;
    }
    local_40 = local_40 + 1;
  }
  std::vector<interest_point,_std::allocator<interest_point>_>::~vector
            ((vector<interest_point,_std::allocator<interest_point>_> *)in_stack_fffffffffffffd60);
  return (bool)(local_39 & 1);
}

Assistant:

bool validate_get_msurf_descriptors(
    void (*original_function)(struct integral_image *, struct interest_point *),
    const std::vector<void (*)(struct integral_image *, struct interest_point *)> &test_functions,
    struct integral_image *iimage, const std::vector<struct interest_point> *interest_points) {
    // Copying over interest points to new vector
    std::vector<struct interest_point> original_interest_points = *interest_points;

    bool all_valid = true;

    for (int i = 50; i < interest_points->size(); ++i) { 

        struct interest_point ref_ipoint = interest_points->at(i);
        original_function(iimage, &ref_ipoint);

        bool valid = true;
        for (int j = 0; j < test_functions.size(); ++j) {
            struct interest_point test_ipoint = interest_points->at(i);

            test_functions[j](iimage, &test_ipoint);

            bool valid = compare_arrays_close(ref_ipoint.descriptor, test_ipoint.descriptor, 64, VALIDATION_PRECISION);
            if (!valid) {
                printf("ERROR: MSURF descriptor test function %d does not match original function\n", j);
            }

            // Updating flag indicating if all functions are valid
            all_valid &= valid;
        }
    }

    return all_valid;
}